

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DistItemSyntax::getChild(DistItemSyntax *this,size_t index)

{
  long in_RDX;
  TokenOrSyntax *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  TokenOrSyntax *pTVar1;
  
  if (in_RDX == 0) {
    pTVar1 = in_RDI;
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 1));
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RDX == 1) {
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    pTVar1 = in_RDI;
  }
  else {
    TokenOrSyntax::TokenOrSyntax(in_RSI,in_RDI);
    pTVar1 = in_RDI;
  }
  return pTVar1;
}

Assistant:

TokenOrSyntax DistItemSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return range.get();
        case 1: return weight;
        default: return nullptr;
    }
}